

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

bool __thiscall GameBoard::canPut(GameBoard *this,int color,int blockType)

{
  bool bVar1;
  int y;
  int y_00;
  int x;
  int o;
  int iVar2;
  Tetris t;
  
  t.shape = blockShape[blockType];
  t.gameBoard = this;
  t.blockType = blockType;
  t.color = color;
  iVar2 = 0x14;
  while (x = iVar2, x != 0) {
    for (y_00 = 1; iVar2 = x + -1, y_00 != 0xb; y_00 = y_00 + 1) {
      for (iVar2 = 0; iVar2 != 4; iVar2 = iVar2 + 1) {
        t.blockX = x;
        t.blockY = y_00;
        t.orientation = iVar2;
        bVar1 = Tetris::isValid(&t,-1,-1,-1);
        if ((bVar1) && (bVar1 = checkDirectDropTo(this,color,blockType,x,y_00,iVar2), bVar1))
        goto LAB_00117a75;
      }
    }
  }
LAB_00117a75:
  return x != 0;
}

Assistant:

bool GameBoard::canPut(int color, int blockType)
{
    Tetris t(this, blockType, color);
    for (int x = MAPHEIGHT; x >= 1; x--)
        for (int y = 1; y <= MAPWIDTH; y++)
            for (int o = 0; o < 4; o++) {
                t.set(x, y, o);
                if (t.isValid() && checkDirectDropTo(color, blockType, x, y, o))
                    return true;
            }
    return false;
}